

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O1

void horn_relax(qnode_ptr_t p,float alpha,int n,char *fn,int prod_err)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  param512_t *papVar7;
  qnode_ptr_t ptVar8;
  qnode_ptr_t q;
  disp_field512_t *padVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  float *pfVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  uint uVar18;
  float fVar19;
  float fVar20;
  undefined4 in_XMM0_Db;
  float fVar21;
  double dVar22;
  float std;
  float avg;
  float local_68;
  float local_64;
  disp_field512_t *local_60;
  qnode_ptr_t local_58;
  long local_50;
  long local_48;
  ulong local_40;
  double local_38;
  
  iVar3 = p->res;
  iVar13 = p->sizx;
  iVar4 = p->sizy;
  iVar17 = p->sizz;
  iVar5 = p->ofst;
  ptVar8 = (qnode_ptr_t)malloc(0x170);
  ptVar8->res = iVar3;
  ptVar8->sizx = iVar13;
  ptVar8->sizy = iVar4;
  ptVar8->sizz = iVar17;
  ptVar8->ofst = iVar5;
  ptVar8->level = 0;
  local_60 = (disp_field512_t *)malloc(0xc3080);
  ptVar8->flow_ptr = local_60;
  if (prod_err != 0) {
    q = (qnode_ptr_t)malloc(0x170);
    q->res = iVar3;
    q->sizx = iVar13;
    q->sizy = iVar4;
    q->sizz = iVar17;
    q->ofst = iVar5;
    q->level = 0;
    padVar9 = (disp_field512_t *)malloc(0xc3080);
    q->flow_ptr = padVar9;
    local_58 = q;
    load_velocity(q,fn);
  }
  uVar12 = p->sizy;
  uVar6 = p->ofst;
  if ((int)uVar6 < (int)uVar12) {
    iVar13 = p->sizx;
    uVar18 = uVar6;
    do {
      if ((int)uVar6 < iVar13) {
        memset(*p->flow_ptr + (long)(int)uVar18 * (long)p->res + (long)(int)uVar6,0,
               (ulong)(~uVar6 + iVar13) * 8 + 8);
      }
      uVar18 = uVar18 + 1;
    } while (uVar12 != uVar18);
  }
  if (0 < n) {
    local_38 = (double)(float)(double)CONCAT44(in_XMM0_Db,alpha) *
               (double)(float)(double)CONCAT44(in_XMM0_Db,alpha);
    local_50 = (long)iVar3 << 3;
    uVar12 = 0;
    do {
      iVar3 = p->ofst;
      lVar10 = (long)iVar3;
      iVar13 = p->sizy;
      if (iVar3 < iVar13) {
        iVar4 = p->ofst;
        iVar17 = p->sizx;
        lVar11 = lVar10 * 8;
        pfVar14 = (float *)((long)&(*local_60)[0].x + local_50 * lVar10);
        lVar15 = lVar10;
        do {
          if (iVar4 < iVar17) {
            iVar5 = p->res;
            padVar9 = p->flow_ptr;
            lVar16 = (long)iVar4;
            do {
              *(undefined8 *)(pfVar14 + lVar16 * 2) =
                   *(undefined8 *)((long)&(*padVar9)[lVar16].x + iVar5 * lVar11);
              lVar16 = lVar16 + 1;
            } while (iVar17 != lVar16);
          }
          lVar15 = lVar15 + 1;
          lVar11 = lVar11 + 8;
          pfVar14 = (float *)((long)pfVar14 + local_50);
        } while (lVar15 != iVar13);
      }
      if (iVar3 < iVar13 - iVar3) {
        iVar4 = p->sizx;
        local_48 = (long)iVar4 + lVar10 * -2;
        iVar17 = iVar3;
        local_40 = (ulong)(uint)(iVar13 - iVar3);
        do {
          if (iVar3 < iVar4 - iVar3) {
            papVar7 = p->param_ptr[p->sizz / 2];
            lVar15 = ((long)iVar17 * (long)p->res + lVar10) * 8;
            lVar11 = local_48;
            iVar13 = iVar3;
            do {
              if ((&(*papVar7)[0].err)[lVar15] == 0) {
                fVar21 = (&(*papVar7)[0].ft)[lVar15];
                fVar1 = (&(*papVar7)[0].fx)[lVar15];
                fVar2 = (&(*papVar7)[0].fy)[lVar15];
                fVar19 = lapu(ptVar8,iVar17,iVar13);
                fVar20 = lapv(ptVar8,iVar17,iVar13);
                fVar21 = fVar19 * fVar1 + fVar2 * fVar20 + fVar21;
                dVar22 = (double)fVar2 * (double)fVar2 + (double)fVar1 * (double)fVar1 + local_38;
                padVar9 = p->flow_ptr;
                *(float *)((long)&(*padVar9)[0].x + lVar15) =
                     (float)((double)fVar19 - (double)(fVar1 * fVar21) / dVar22);
                *(float *)((long)&(*padVar9)[0].y + lVar15) =
                     (float)((double)fVar20 - (double)(fVar21 * fVar2) / dVar22);
              }
              iVar13 = iVar13 + 1;
              lVar15 = lVar15 + 8;
              lVar11 = lVar11 + -1;
            } while (lVar11 != 0);
          }
          iVar17 = iVar17 + 1;
        } while (iVar17 != (int)local_40);
      }
      uVar12 = uVar12 + 1;
      printf(" Iteration %3d :\n",(ulong)uVar12);
      if (prod_err != 0) {
        flow_error(p,local_58,&local_64,&local_68);
        printf("    Average Angular Error : %10.5f\n",(double)local_64);
        printf("       Standard Deviation : %10.5f\n",(double)local_68);
      }
      fVar21 = flow_l2_norm(ptVar8,p);
      printf("       L2 Norm Difference : %10.5f\n",(double)fVar21);
      fflush(_stdout);
    } while (uVar12 != n);
  }
  free(local_60);
  free(ptVar8);
  ptVar8 = local_58;
  if (prod_err != 0) {
    free(local_58->flow_ptr);
    free(ptVar8);
    return;
  }
  return;
}

Assistant:

void horn_relax(p,alpha,n,fn,prod_err)
qnode_ptr_t p ;
float alpha ;
int n, prod_err ;
string fn ;

{ qnode_ptr_t create_node(), q, r ;
  param_t f ;
  float lapu(), lapv(), flow_l2_norm(), u_bar, v_bar, avg, std ;
  int i, j, k ;

  q = create_node(0,p->res,p->sizx,p->sizy,p->sizz,p->ofst) ;
  q->flow_ptr = (disp_field512_t *)malloc(sizeof(disp_field512_t)) ;

  if (prod_err) {
    r = create_node(0,p->res,p->sizx,p->sizy,p->sizz,p->ofst) ;
    r->flow_ptr = (disp_field512_t *)malloc(sizeof(disp_field512_t)) ;
    load_velocity(r,fn) ;
  }

  for (i = p->ofst ; i < p->sizy ; i++) {
    for (j = p->ofst ; j < p->sizx ; j++) {
      (*p->flow_ptr)[p->res*i + j].x = 0.0 ;
      (*p->flow_ptr)[p->res*i + j].y = 0.0 ;
    }
  }
  for (k = 0 ; k < n ; k++) {
    for (i = p->ofst ; i < p->sizy ; i++) {
      for (j = p->ofst ; j < p->sizx ; j++) {
        (*q->flow_ptr)[q->res*i + j] = (*p->flow_ptr)[p->res*i + j] ;
      }
    }
    for (i = p->ofst ; i < p->sizy - p->ofst ; i++) {
      for (j = p->ofst ; j < p->sizx - p->ofst ; j++) {
        if ((*p->param_ptr[p->sizz/2])[p->res*i + j].err == NO_ERROR) {
          f = (*p->param_ptr[p->sizz/2])[p->res*i + j] ;

          u_bar = lapu(q,i,j) ;
          v_bar = lapv(q,i,j) ;

          (*p->flow_ptr)[p->res*i + j].x =
          u_bar - f.fx*(f.fx*u_bar + f.fy*v_bar + f.ft)
          /(pow(f.fx,2.0) + pow(f.fy,2.0) + pow(alpha,2.0)) ;

          (*p->flow_ptr)[p->res*i + j].y =
          v_bar - f.fy*(f.fx*u_bar + f.fy*v_bar + f.ft)
          /(pow(f.fx,2.0) + pow(f.fy,2.0) + pow(alpha,2.0)) ;
        }
      }
    }
    printf(" Iteration %3d :\n",k+1) ;
    if (prod_err) {
      flow_error(p,r,&avg,&std) ;
      printf("    Average Angular Error : %10.5f\n",avg) ;
      printf("       Standard Deviation : %10.5f\n",std) ;
    }
    printf("       L2 Norm Difference : %10.5f\n",flow_l2_norm(q,p)) ;
    fflush(stdout) ;
  }
  free((disp_field512_t *)q->flow_ptr) ;
  free(q) ;
  if (prod_err) {
    free((disp_field512_t *)r->flow_ptr) ;
    free(r) ;
  }
}